

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O1

int zueci_gb18030_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  zueci_u32 zVar10;
  uint uVar11;
  
  bVar1 = *src;
  zVar10 = (zueci_u32)bVar1;
  iVar5 = 1;
  if (-1 < (char)bVar1) goto LAB_00191fd5;
  if (len < 2) {
    return 0;
  }
  uVar7 = (uint)bVar1;
  if (uVar7 == 0x80) {
    return 0;
  }
  if (uVar7 == 0xff) {
    return 0;
  }
  iVar5 = zueci_gbk_u(src,len,flags,p_u);
  if (iVar5 != 0) {
    return iVar5;
  }
  bVar2 = src[1];
  uVar11 = (uint)bVar2;
  if (((bVar1 < 0xe4) && (3 < len)) && ((byte)(bVar2 - 0x30) < 10)) {
    bVar2 = src[2];
    bVar3 = src[3];
    uVar7 = (uint)bVar2 << 8 | uVar11 << 0x10 | zVar10 << 0x18 | (uint)bVar3;
    if (uVar7 < 0x81308130) {
      return 0;
    }
    if ((byte)(bVar3 - 0x3a) < 0xf6) {
      return 0;
    }
    if ((byte)(bVar2 + 1) < 0x82) {
      return 0;
    }
    if (0xe3329a35 < uVar7) {
      return 0;
    }
    if (uVar7 + 0x7bce5bc6 < 0xbfedcf6) {
      return 0;
    }
    iVar5 = 4;
    if (uVar7 == 0x8135f437) {
      zVar10 = 0xe7c7;
    }
    else if (bVar1 < 0x90) {
      iVar9 = 0;
      iVar6 = 0xcd;
      do {
        iVar8 = iVar6 + iVar9 >> 1;
        if (zueci_gb18030_4_mb_e[iVar8] < uVar7) {
          iVar9 = iVar8 + 1;
          iVar8 = iVar6;
        }
        iVar6 = iVar8;
      } while (iVar9 < iVar6);
      uVar7 = zueci_gb18030_4_mb_e[iVar9];
      zVar10 = (((uint)zueci_gb18030_4_u_e[iVar9] + (uint)bVar3) - (uVar7 & 0xff)) +
               ((uVar11 + zVar10 * 10) * 0x7e + (uint)bVar2 +
               (((uVar7 >> 0x10 & 0xff) + (uVar7 >> 0x18) * 10) * -0x7e - (uVar7 >> 8 & 0xff))) * 10
      ;
    }
    else {
      zVar10 = ((uint)bVar3 + ((uVar11 + zVar10 * 10) * 0x276 + (uint)bVar2 * 5) * 2) - 0x1ba0fa;
    }
    goto LAB_00191fd5;
  }
  if ((byte)(bVar2 + 1) < 0x41 || uVar11 == 0x7f) {
    return 0;
  }
  if ((byte)(bVar1 + 0x56) < 6) {
    if (0xa0 < bVar2) goto LAB_00192110;
LAB_001920c7:
    if (0xa1 < bVar2 || 6 < (byte)(bVar1 + 0x5f)) {
      if ((uVar7 != 0xfe) || (0x40 < (byte)(bVar2 + 0xaf))) {
LAB_00192277:
        if (0x5bf5 < (uVar7 * 0x100 + uVar11) - 0xa2ab) {
          return 0;
        }
        uVar11 = uVar7 * 0x100 | uVar11;
        iVar9 = 0xfe;
        iVar5 = 0;
        do {
          if (iVar9 < iVar5) {
            return 0;
          }
          iVar6 = iVar9 + iVar5 >> 1;
          if (zueci_gb18030_2_mb_mb[iVar6] < uVar11) {
            iVar5 = iVar6 + 1;
            bVar4 = true;
          }
          else if (uVar11 < zueci_gb18030_2_mb_mb[iVar6]) {
            iVar9 = iVar6 + -1;
            bVar4 = true;
          }
          else {
            *p_u = (uint)zueci_gb18030_2_mb_u[iVar6];
            bVar4 = false;
          }
        } while (bVar4);
        return 2;
      }
      iVar5 = 2;
      if (uVar11 == 0x6b || bVar2 < 0x6b) {
        if (uVar11 == 0x51) {
          zVar10 = 0x20087;
        }
        else if (uVar11 == 0x52) {
          zVar10 = 0x20089;
        }
        else {
          if (uVar11 != 0x53) goto LAB_00192277;
          zVar10 = 0x200cc;
        }
      }
      else if (uVar11 == 0x6c) {
        zVar10 = 0x215d7;
      }
      else if (uVar11 == 0x76) {
        zVar10 = 0x2298f;
      }
      else {
        if (uVar11 != 0x91) goto LAB_00192277;
        zVar10 = 0x241fe;
      }
      goto LAB_00191fd5;
    }
    zVar10 = (int)((char)bVar2 >> 7) + zVar10 * 0x60 + uVar11 + 0xa826;
  }
  else {
    if (bVar1 < 0xf8 || bVar2 < 0xa1) goto LAB_001920c7;
LAB_00192110:
    iVar5 = zVar10 - 0xf2;
    if (bVar1 < 0xf8) {
      iVar5 = zVar10 - 0xaa;
    }
    zVar10 = iVar5 * 0x5e + uVar11 + 0xdf5f;
  }
  iVar5 = 2;
LAB_00191fd5:
  *p_u = zVar10;
  return iVar5;
}

Assistant:

static int zueci_gb18030_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2, c3, c4;
    int ret;
    zueci_u16 mb2;
    zueci_u32 mb4;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    if ((ret = zueci_gbk_u(src, len, 0 /*flags*/, p_u))) {
        return ret;
    }
    c2 = src[1];
    if (len >= 4 && c2 <= 0x39 && c2 >= 0x30 && c1 >= 0x81 && c1 <= 0xE3) {
        c3 = src[2];
        c4 = src[3];
        mb4 = ZUECI_4BYTES_U32(c1, c2, c3, c4);
        if (mb4 < 0x81308130 || (mb4 > 0x8431A439 && mb4 < 0x90308130) || mb4 > 0xE3329A35
                || c3 < 0x81 || c3 > 0xFE || c4 < 0x30 || c4 > 0x39) {
            return 0;
        }
        if (mb4 == 0x8135F437) { /* PUA change to non-PUA, see Table 3-39, Lunde, 2nd ed. */
            *p_u = 0xE7C7;
            return 4;
        }
        if (c1 >= 0x90) { /* Non-BMP */
            *p_u = 0x10000 + (((c1 - 0x90) * 10 + (c2 - 0x30)) * 126 + (c3 - 0x81)) * 10 + c4 - 0x30;
        } else { /* BMP */
            int s = 0;
            int e = ZUECI_ASIZE(zueci_gb18030_4_mb_e) - 1;
            while (s < e) { /* Lower bound */
                const int m = (s + e) >> 1;
                if (zueci_gb18030_4_mb_e[m] < mb4) {
                    s = m + 1;
                } else {
                    e = m;
                }
            }
            assert(s < ZUECI_ASIZE(zueci_gb18030_4_mb_e));
            *p_u = zueci_gb18030_4_u_e[s] - (zueci_gb18030_mb4_u(zueci_gb18030_4_mb_e[s]) - zueci_gb18030_mb4_u(mb4));
        }
        return 4;
    }
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }
    if (((c1 >= 0xAA && c1 <= 0xAF) || (c1 >= 0xF8 && c1 <= 0xFE)) && c2 >= 0xA1 && c2 <= 0xFE) { /* UDA-1/2 PUA */
        *p_u = 0xE000 + (0xFF - 0xA0 - 1) * (c1 - (c1 >= 0xF8 ? 0xF2 : 0xAA)) + c2 - 0xA1;
        return 2;
    }
    if (c1 >= 0xA1 && c1 <= 0xA7 && c2 <= 0xA1) { /* UDA-3 PUA */
        *p_u = 0xE4C6 + (0xA1 - 0x40 - 1) * (c1 - 0xA1) + c2 - 0x40 - (c2 > 0x7F);
        return 2;
    }
    if (c1 == 0xFE && c2 >= 0x51 && c2 <= 0x91) {
        /* Non-BMP that were PUA, see Table 3-37, Lunde, 2nd ed. */
        if (c2 == 0x51) {
            *p_u = 0x20087;
            return 2;
        }
        if (c2 == 0x52) {
            *p_u = 0x20089;
            return 2;
        }
        if (c2 == 0x53) {
            *p_u = 0x200CC;
            return 2;
        }
        if (c2 == 0x6C) {
            *p_u = 0x215D7;
            return 2;
        }
        if (c2 == 0x76) {
            *p_u = 0x2298F;
            return 2;
        }
        if (c2 == 0x91) {
            *p_u = 0x241FE;
            return 2;
        }
    }
    mb2 = ((zueci_u16) c1 << 8) | c2;
    if (mb2 >= zueci_gb18030_2_mb_mb[0] && mb2 <= zueci_gb18030_2_mb_mb[ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gb18030_2_mb_mb[m] < mb2) {
                s = m + 1;
            } else if (zueci_gb18030_2_mb_mb[m] > mb2) {
                e = m - 1;
            } else {
                *p_u = zueci_gb18030_2_mb_u[m];
                return 2;
            }
        }
    }
    return 0;
}